

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O2

float mpack_node_float(mpack_node_t node)

{
  ulong uVar1;
  mpack_node_data_t *pmVar2;
  
  pmVar2 = node.data;
  if ((node.tree)->error == mpack_ok) {
    switch(pmVar2->type) {
    case mpack_type_int:
      return (float)(pmVar2->value).i;
    case mpack_type_uint:
      goto switchD_00104b01_caseD_4;
    case mpack_type_float:
      return (pmVar2->value).f;
    case mpack_type_double:
      return (float)(pmVar2->value).d;
    default:
      mpack_tree_flag_error(node.tree,mpack_error_type);
      return 0.0;
    }
  }
  return 0.0;
switchD_00104b01_caseD_4:
  uVar1 = (pmVar2->value).i;
  if ((long)uVar1 < 0) {
    return (float)uVar1;
  }
  return (float)(long)uVar1;
}

Assistant:

MPACK_INLINE float mpack_node_float(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0.0f;

    if (node.data->type == mpack_type_uint)
        return (float)node.data->value.u;
    else if (node.data->type == mpack_type_int)
        return (float)node.data->value.i;
    else if (node.data->type == mpack_type_float)
        return node.data->value.f;
    else if (node.data->type == mpack_type_double)
        return (float)node.data->value.d;

    mpack_node_flag_error(node, mpack_error_type);
    return 0.0f;
}